

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O0

void __thiscall wasm::Flatten::visitFunction(Flatten *this,Function *curr)

{
  Expression *func;
  bool bVar1;
  Return *pRVar2;
  Expression *pEVar3;
  Module *pMVar4;
  Builder local_28;
  Expression *local_20;
  Expression *originalBody;
  Function *curr_local;
  Flatten *this_local;
  
  local_20 = curr->body;
  originalBody = (Expression *)curr;
  curr_local = (Function *)this;
  bVar1 = wasm::Type::isConcrete(&curr->body->type);
  if (bVar1) {
    pMVar4 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::getModule
                       ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                         *)&(this->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                       );
    Builder::Builder(&local_28,pMVar4);
    pRVar2 = Builder::makeReturn(&local_28,*(Expression **)(originalBody + 6));
    *(Return **)(originalBody + 6) = pRVar2;
  }
  pEVar3 = getPreludesWithExpression(this,local_20,*(Expression **)(originalBody + 6));
  func = originalBody;
  *(Expression **)(originalBody + 6) = pEVar3;
  pMVar4 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::getModule
                     ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *
                      )&(this->
                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                        ).
                        super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                     );
  EHUtils::handleBlockNestedPops((Function *)func,pMVar4,SkipIfNoEH);
  return;
}

Assistant:

void visitFunction(Function* curr) {
    auto* originalBody = curr->body;
    // if the body is a block with a result, turn that into a return
    if (curr->body->type.isConcrete()) {
      curr->body = Builder(*getModule()).makeReturn(curr->body);
    }
    // the body may have preludes
    curr->body = getPreludesWithExpression(originalBody, curr->body);

    // Flatten can generate blocks within 'catch', making pops invalid. Fix them
    // up.
    EHUtils::handleBlockNestedPops(curr, *getModule());
  }